

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

word Exp_Truth6Lit(int nVars,int Lit,word *puFanins,word *puNodes)

{
  ulong local_48;
  ulong local_30;
  word *puNodes_local;
  word *puFanins_local;
  int Lit_local;
  int nVars_local;
  
  if (Lit == -1) {
    _Lit_local = 0;
  }
  else if (Lit == -2) {
    _Lit_local = 0xffffffffffffffff;
  }
  else if (SBORROW4(Lit,nVars * 2) == Lit + nVars * -2 < 0) {
    if ((Lit & 1U) == 0) {
      local_48 = puNodes[Lit / 2 - nVars];
    }
    else {
      local_48 = puNodes[Lit / 2 - nVars] ^ 0xffffffffffffffff;
    }
    _Lit_local = local_48;
  }
  else {
    if ((Lit & 1U) == 0) {
      local_30 = puFanins[Lit / 2];
    }
    else {
      local_30 = puFanins[Lit / 2] ^ 0xffffffffffffffff;
    }
    _Lit_local = local_30;
  }
  return _Lit_local;
}

Assistant:

static inline word Exp_Truth6Lit( int nVars, int Lit, word * puFanins, word * puNodes )
{
    if ( Lit == EXP_CONST0 )
        return 0;
    if ( Lit == EXP_CONST1 )
        return ~(word)0;
    if ( Lit < 2 * nVars )
        return  (Lit&1) ? ~puFanins[Lit/2] : puFanins[Lit/2];
    return (Lit&1) ? ~puNodes[Lit/2-nVars] : puNodes[Lit/2-nVars];
}